

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_read_write_wire.c
# Opt level: O3

int main(void)

{
  PaError PVar1;
  uint uVar2;
  PaDeviceInfo *pPVar3;
  PaDeviceInfo *pPVar4;
  void *buffer;
  int iVar5;
  PaStream *stream;
  PaStreamParameters outputParameters;
  PaStreamParameters inputParameters;
  PaStream *local_78;
  PaStreamParameters local_70;
  PaStreamParameters local_50;
  
  local_78 = (PaStream *)0x0;
  puts("patest_read_write_wire.c");
  fflush(_stdout);
  printf("sizeof(int) = %lu\n",4);
  fflush(_stdout);
  printf("sizeof(long) = %lu\n",8);
  fflush(_stdout);
  PVar1 = Pa_Initialize();
  if (PVar1 == 0) {
    uVar2 = Pa_GetDefaultInputDevice();
    local_50.device = uVar2;
    printf("Input device # %d.\n",(ulong)uVar2);
    pPVar3 = Pa_GetDeviceInfo(uVar2);
    printf("    Name: %s\n",pPVar3->name);
    printf("      LL: %g s\n",pPVar3->defaultLowInputLatency);
    printf("      HL: %g s\n",pPVar3->defaultHighInputLatency);
    uVar2 = Pa_GetDefaultOutputDevice();
    local_70.device = uVar2;
    printf("Output device # %d.\n",(ulong)uVar2);
    pPVar4 = Pa_GetDeviceInfo(uVar2);
    printf("   Name: %s\n",pPVar4->name);
    printf("     LL: %g s\n",pPVar4->defaultLowOutputLatency);
    printf("     HL: %g s\n",pPVar4->defaultHighOutputLatency);
    uVar2 = pPVar4->maxOutputChannels;
    if (pPVar3->maxInputChannels < pPVar4->maxOutputChannels) {
      uVar2 = pPVar3->maxInputChannels;
    }
    printf("Num channels = %d.\n",(ulong)uVar2);
    local_50.sampleFormat = 1;
    local_50.suggestedLatency = pPVar3->defaultHighInputLatency;
    local_50.hostApiSpecificStreamInfo = (void *)0x0;
    local_70.sampleFormat = 1;
    local_70.suggestedLatency = pPVar4->defaultHighOutputLatency;
    local_70.hostApiSpecificStreamInfo = (void *)0x0;
    local_70.channelCount = uVar2;
    local_50.channelCount = uVar2;
    PVar1 = Pa_OpenStream(&local_78,&local_50,&local_70,44100.0,0x200,1,(PaStreamCallback *)0x0,
                          (void *)0x0);
    if (PVar1 == 0) {
      buffer = calloc(1,(long)(int)(uVar2 << 0xb));
      if (buffer == (void *)0x0) {
        puts("Could not allocate record array.");
      }
      else {
        PVar1 = Pa_StartStream(local_78);
        if (PVar1 == 0) {
          printf("Wire on. Will run %d seconds.\n",10);
          fflush(_stdout);
          iVar5 = 0x35d;
          do {
            uVar2 = Pa_WriteStream(local_78,buffer,0x200);
            if ((uVar2 != 0) || (uVar2 = Pa_ReadStream(local_78,buffer,0x200), uVar2 != 0)) {
              printf("err = %d\n",(ulong)uVar2);
              fflush(_stdout);
              if (local_78 != (PaStream *)0x0) {
                Pa_AbortStream(local_78);
                Pa_CloseStream(local_78);
              }
              free(buffer);
              Pa_Terminate();
              if ((uVar2 & 2) != 0) {
                main_cold_1();
              }
              if ((uVar2 & 4) == 0) {
                return -2;
              }
              main_cold_2();
              return -2;
            }
            iVar5 = iVar5 + -1;
          } while (iVar5 != 0);
          puts("Wire off.");
          fflush(_stdout);
          PVar1 = Pa_StopStream(local_78);
          if (PVar1 == 0) {
            free(buffer);
            Pa_Terminate();
            return 0;
          }
        }
      }
      free(buffer);
    }
  }
  main_cold_3();
  return -1;
}

Assistant:

int main(void)
{
    PaStreamParameters inputParameters, outputParameters;
    PaStream *stream = NULL;
    PaError err;
    const PaDeviceInfo* inputInfo;
    const PaDeviceInfo* outputInfo;
    char *sampleBlock = NULL;
    int i;
    int numBytes;

    printf("patest_read_write_wire.c\n"); fflush(stdout);
    printf("sizeof(int) = %lu\n", sizeof(int)); fflush(stdout);
    printf("sizeof(long) = %lu\n", sizeof(long)); fflush(stdout);

    err = Pa_Initialize();
    if( err != paNoError ) goto error2;

    inputParameters.device = Pa_GetDefaultInputDevice(); /* default input device */
    printf( "Input device # %d.\n", inputParameters.device );
    inputInfo = Pa_GetDeviceInfo( inputParameters.device );
    printf( "    Name: %s\n", inputInfo->name );
    printf( "      LL: %g s\n", inputInfo->defaultLowInputLatency );
    printf( "      HL: %g s\n", inputInfo->defaultHighInputLatency );

    outputParameters.device = Pa_GetDefaultOutputDevice(); /* default output device */
    printf( "Output device # %d.\n", outputParameters.device );
    outputInfo = Pa_GetDeviceInfo( outputParameters.device );
    printf( "   Name: %s\n", outputInfo->name );
    printf( "     LL: %g s\n", outputInfo->defaultLowOutputLatency );
    printf( "     HL: %g s\n", outputInfo->defaultHighOutputLatency );

    int numChannels = inputInfo->maxInputChannels < outputInfo->maxOutputChannels
            ? inputInfo->maxInputChannels : outputInfo->maxOutputChannels;
    printf( "Num channels = %d.\n", numChannels );

    inputParameters.channelCount = numChannels;
    inputParameters.sampleFormat = PA_SAMPLE_TYPE;
    inputParameters.suggestedLatency = inputInfo->defaultHighInputLatency ;
    inputParameters.hostApiSpecificStreamInfo = NULL;

    outputParameters.channelCount = numChannels;
    outputParameters.sampleFormat = PA_SAMPLE_TYPE;
    outputParameters.suggestedLatency = outputInfo->defaultHighOutputLatency;
    outputParameters.hostApiSpecificStreamInfo = NULL;

    /* -- setup -- */

    err = Pa_OpenStream(
              &stream,
              &inputParameters,
              &outputParameters,
              SAMPLE_RATE,
              FRAMES_PER_BUFFER,
              paClipOff,      /* we won't output out of range samples so don't bother clipping them */
              NULL, /* no callback, use blocking API */
              NULL ); /* no callback, so no callback userData */
    if( err != paNoError ) goto error2;

    numBytes = FRAMES_PER_BUFFER * numChannels * SAMPLE_SIZE ;
    sampleBlock = (char *) malloc( numBytes );
    if( sampleBlock == NULL )
    {
        printf("Could not allocate record array.\n");
        goto error1;
    }
    memset( sampleBlock, SAMPLE_SILENCE, numBytes );

    err = Pa_StartStream( stream );
    if( err != paNoError ) goto error1;
    printf("Wire on. Will run %d seconds.\n", NUM_SECONDS); fflush(stdout);

    for( i=0; i<(NUM_SECONDS*SAMPLE_RATE)/FRAMES_PER_BUFFER; ++i )
    {
        // You may get underruns or overruns if the output is not primed by PortAudio.
        err = Pa_WriteStream( stream, sampleBlock, FRAMES_PER_BUFFER );
        if( err ) goto xrun;
        err = Pa_ReadStream( stream, sampleBlock, FRAMES_PER_BUFFER );
        if( err ) goto xrun;
    }
    printf("Wire off.\n"); fflush(stdout);

    err = Pa_StopStream( stream );
    if( err != paNoError ) goto error1;

    free( sampleBlock );

    Pa_Terminate();
    return 0;

xrun:
    printf("err = %d\n", err); fflush(stdout);
    if( stream ) {
       Pa_AbortStream( stream );
       Pa_CloseStream( stream );
    }
    free( sampleBlock );
    Pa_Terminate();
    if( err & paInputOverflow )
       fprintf( stderr, "Input Overflow.\n" );
    if( err & paOutputUnderflow )
       fprintf( stderr, "Output Underflow.\n" );
    return -2;
error1:
    free( sampleBlock );
error2:
    if( stream ) {
       Pa_AbortStream( stream );
       Pa_CloseStream( stream );
    }
    Pa_Terminate();
    fprintf( stderr, "An error occured while using the portaudio stream\n" );
    fprintf( stderr, "Error number: %d\n", err );
    fprintf( stderr, "Error message: %s\n", Pa_GetErrorText( err ) );
    return -1;
}